

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int encode_session_identifier
              (ptls_buffer_t *buf,uint32_t ticket_age_add,st_ptls_key_schedule_t *sched,
              char *server_name,uint16_t csid)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t len;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  timeval tv;
  timeval local_40;
  
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar7 = buf->off;
    (puVar1 + sVar7)[0] = '\0';
    (puVar1 + sVar7)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  sVar7 = buf->off;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  iVar3 = ptls_buffer_reserve(buf,8);
  if (iVar3 == 0) {
    uVar4 = local_40.tv_sec * 1000 + local_40.tv_usec / 1000;
    *(ulong *)(buf->base + buf->off) =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    buf->off = buf->off + 8;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar8 = buf->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    sVar8 = buf->off;
    iVar3 = ptls_buffer_reserve(buf,sched->algo->digest_size);
    if ((iVar3 == 0) &&
       (iVar3 = derive_secret(sched,buf->base + buf->off,"resumption master secret"), iVar3 == 0)) {
      sVar5 = buf->off + sched->algo->digest_size;
      buf->off = sVar5;
      uVar4 = sVar5 - sVar8;
      lVar6 = 8;
      do {
        buf->base[sVar8 - 2] = (uint8_t)(uVar4 >> ((byte)lVar6 & 0x3f));
        lVar6 = lVar6 + -8;
        sVar8 = sVar8 + 1;
      } while (lVar6 != -8);
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    *(uint16_t *)(buf->base + buf->off) = csid << 8 | csid >> 8;
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(buf,4);
  if (iVar3 == 0) {
    *(uint32_t *)(buf->base + buf->off) =
         ticket_age_add >> 0x18 | (ticket_age_add & 0xff0000) >> 8 | (ticket_age_add & 0xff00) << 8
         | ticket_age_add << 0x18;
    buf->off = buf->off + 4;
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar8 = buf->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    sVar8 = buf->off;
    if (server_name != (char *)0x0) {
      len = strlen(server_name);
      iVar3 = ptls_buffer__do_pushv(buf,server_name,len);
      if (iVar3 != 0) goto LAB_0010aa63;
    }
    uVar4 = buf->off - sVar8;
    lVar6 = 8;
    do {
      buf->base[sVar8 - 2] = (uint8_t)(uVar4 >> ((byte)lVar6 & 0x3f));
      lVar6 = lVar6 + -8;
      sVar8 = sVar8 + 1;
    } while (lVar6 != -8);
    iVar3 = 0;
    bVar2 = true;
  }
  else {
LAB_0010aa63:
    bVar2 = false;
  }
  if (bVar2) {
    uVar4 = buf->off - sVar7;
    lVar6 = 8;
    do {
      buf->base[sVar7 - 2] = (uint8_t)(uVar4 >> ((byte)lVar6 & 0x3f));
      lVar6 = lVar6 + -8;
      sVar7 = sVar7 + 1;
    } while (lVar6 != -8);
  }
  return iVar3;
}

Assistant:

int encode_session_identifier(ptls_buffer_t *buf, uint32_t ticket_age_add, struct st_ptls_key_schedule_t *sched,
                              const char *server_name, uint16_t csid)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* date */
        ptls_buffer_push64(buf, gettime_millis());
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off)) != 0)
                goto Exit;
            buf->off += sched->algo->digest_size;
        });
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* server-name */
        ptls_buffer_push_block(buf, 2, {
            if (server_name != NULL)
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
        });
    });

Exit:
    return ret;
}